

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O3

void sort_rooms(level *lev,int levstyle)

{
  mkroom *__src;
  ulong uVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [12];
  unkbyte10 Var4;
  undefined1 auVar5 [12];
  void *__dest;
  void *__dest_00;
  void *__base;
  int *piVar6;
  char cVar7;
  size_t sVar8;
  mkroom *pmVar9;
  long lVar10;
  size_t __nmemb;
  code *__compar;
  long lVar11;
  int iVar12;
  undefined1 auVar13 [16];
  undefined1 auVar21 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined2 uVar24;
  
  iVar12 = lev->nroom;
  if (0 < iVar12) {
    __compar = sort_rooms_standard_comp;
    switch(levstyle) {
    case 0:
    case 1:
    case 3:
      break;
    case 2:
      __compar = sort_rooms_ring_comp;
      break;
    case 4:
      goto switchD_001d68ef_caseD_4;
    default:
      warning("sort_rooms: unknown levstyle %d");
      iVar12 = lev->nroom;
    }
    __dest = xmalloc(iVar12 * 0xd8);
    __src = lev->rooms;
    memcpy(__dest,__src,(long)lev->nroom * 0xd8);
    if (lev->doorindex < 1) {
      __dest_00 = (void *)0x0;
    }
    else {
      __dest_00 = xmalloc(lev->doorindex * 2);
      memcpy(__dest_00,lev->doors,(long)lev->doorindex * 2);
    }
    __base = xmalloc(lev->nroom * 0x14);
    __nmemb = (size_t)lev->nroom;
    if (0 < (long)__nmemb) {
      piVar6 = (int *)((long)__base + 4);
      sVar8 = 0;
      pmVar9 = __src;
      do {
        piVar6[-1] = (int)sVar8;
        uVar1._0_1_ = pmVar9->lx;
        uVar1._1_1_ = pmVar9->hx;
        uVar1._2_1_ = pmVar9->ly;
        uVar1._3_1_ = pmVar9->hy;
        uVar1._4_1_ = pmVar9->rtype;
        uVar1._5_1_ = pmVar9->rlit;
        uVar1._6_1_ = pmVar9->needfill;
        uVar1._7_1_ = pmVar9->doorct;
        auVar20._8_6_ = 0;
        auVar20._0_8_ = uVar1;
        auVar20[0xe] = uVar1._7_1_;
        auVar20[0xf] = uVar1._7_1_;
        auVar19._14_2_ = auVar20._14_2_;
        auVar19._8_5_ = 0;
        auVar19._0_8_ = uVar1;
        auVar19[0xd] = uVar1._6_1_;
        auVar18._13_3_ = auVar19._13_3_;
        auVar18._8_4_ = 0;
        auVar18._0_8_ = uVar1;
        auVar18[0xc] = uVar1._6_1_;
        auVar17._12_4_ = auVar18._12_4_;
        auVar17._8_3_ = 0;
        auVar17._0_8_ = uVar1;
        auVar17[0xb] = uVar1._5_1_;
        auVar16._11_5_ = auVar17._11_5_;
        auVar16._8_2_ = 0;
        auVar16._0_8_ = uVar1;
        auVar16[10] = uVar1._5_1_;
        auVar15._10_6_ = auVar16._10_6_;
        auVar15[8] = 0;
        auVar15._0_8_ = uVar1;
        auVar15[9] = uVar1._4_1_;
        auVar14._9_7_ = auVar15._9_7_;
        auVar14[8] = uVar1._4_1_;
        auVar14._0_8_ = uVar1;
        Var4 = CONCAT91(CONCAT81(auVar14._8_8_,uVar1._3_1_),uVar1._3_1_);
        auVar3._2_10_ = Var4;
        auVar3[1] = uVar1._2_1_;
        auVar3[0] = uVar1._2_1_;
        auVar2._2_12_ = auVar3;
        auVar2[1] = uVar1._1_1_;
        auVar2[0] = uVar1._1_1_;
        auVar13._0_2_ = CONCAT11((undefined1)uVar1,(undefined1)uVar1);
        auVar13._2_14_ = auVar2;
        uVar24 = (undefined2)Var4;
        auVar23._0_12_ = auVar13._0_12_;
        auVar23._12_2_ = uVar24;
        auVar23._14_2_ = uVar24;
        auVar22._12_4_ = auVar23._12_4_;
        auVar22._0_10_ = auVar13._0_10_;
        auVar22._10_2_ = auVar3._0_2_;
        auVar21._10_6_ = auVar22._10_6_;
        auVar21._0_8_ = auVar13._0_8_;
        auVar21._8_2_ = auVar3._0_2_;
        auVar5._4_8_ = auVar21._8_8_;
        auVar5._2_2_ = auVar2._0_2_;
        auVar5._0_2_ = auVar2._0_2_;
        *piVar6 = (int)auVar13._0_2_ >> 8;
        piVar6[1] = auVar21._8_4_ >> 0x18;
        piVar6[2] = auVar5._0_4_ >> 0x18;
        piVar6[3] = auVar22._12_4_ >> 0x18;
        sVar8 = sVar8 + 1;
        pmVar9 = pmVar9 + 1;
        piVar6 = piVar6 + 5;
      } while (__nmemb != sVar8);
    }
    qsort(__base,__nmemb,0x14,__compar);
    if (0 < lev->nroom) {
      lVar11 = 0;
      iVar12 = 0;
      do {
        pmVar9 = __src + lVar11;
        memcpy(pmVar9,(void *)((long)*(int *)((long)__base + lVar11 * 0x14) * 0xd8 + (long)__dest),
               0xd8);
        if (__dest_00 != (void *)0x0) {
          cVar7 = pmVar9->doorct;
          if ('\0' < cVar7) {
            lVar10 = 0;
            do {
              lev->doors[iVar12 + lVar10] =
                   *(coord *)((long)__dest_00 + (pmVar9->fdoor + lVar10) * 2);
              lVar10 = lVar10 + 1;
              cVar7 = pmVar9->doorct;
            } while (lVar10 < cVar7);
          }
          pmVar9->fdoor = (schar)iVar12;
          iVar12 = iVar12 + cVar7;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < lev->nroom);
    }
  }
switchD_001d68ef_caseD_4:
  return;
}

Assistant:

void sort_rooms(struct level *lev, int levstyle)
{
	struct mkroom *tmprooms;
	coord *tmpdoors;
	struct sort_rooms_data *sortable;
	int (*sort_func)(const void *, const void *);
	int i, j, new_door_index;

	if (lev->nroom < 1) return;

	/* required for corridors of some level styles */
	switch (levstyle) {
	default:
	    warning("sort_rooms: unknown levstyle %d", levstyle);
	    /* fall through */
	case LEVSTYLE_STANDARD:
	case LEVSTYLE_ANYTOANY:
	case LEVSTYLE_HUB:
	    sort_func = sort_rooms_standard_comp;
	    break;
	case LEVSTYLE_RING:
	    sort_func = sort_rooms_ring_comp;
	    break;
	case LEVSTYLE_GRID:
	    /* no sorting */
	    return;
	}

	/* save rooms and doors in their original order */
	tmprooms = xmalloc(lev->nroom * sizeof(struct mkroom));
	memcpy(tmprooms, lev->rooms, lev->nroom * sizeof(struct mkroom));
	if (lev->doorindex > 0) {
		tmpdoors = xmalloc(lev->doorindex * sizeof(coord));
		memcpy(tmpdoors, lev->doors, lev->doorindex * sizeof(coord));
	} else {
		tmpdoors = NULL;
	}

	/* sort rooms from left to right */
	sortable = xmalloc(lev->nroom * sizeof(struct sort_rooms_data));
	for (i = 0; i < lev->nroom; i++) {
		sortable[i].room_index = i;
		sortable[i].lx = lev->rooms[i].lx;
		sortable[i].ly = lev->rooms[i].ly;
		sortable[i].hx = lev->rooms[i].hx;
		sortable[i].hy = lev->rooms[i].hy;
	}
	qsort(sortable, lev->nroom, sizeof(struct sort_rooms_data), sort_func);

	/* apply room sorting */
	new_door_index = 0;
	for (i = 0; i < lev->nroom; i++) {
		struct mkroom *room;
		lev->rooms[i] = tmprooms[sortable[i].room_index];
		room = &lev->rooms[i];

		/* reorder doors to match sorted room order */
		if (!tmpdoors) continue;
		for (j = 0; j < room->doorct; j++)
			lev->doors[new_door_index + j] = tmpdoors[room->fdoor + j];
		room->fdoor = new_door_index;
		new_door_index += room->doorct;
	}
}